

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseForResult<Func,_void> __thiscall
kj::RetryOnDisconnect_<Func_&>::apply(RetryOnDisconnect_<Func_&> *this,Func *func)

{
  SourceLocation location;
  SourceLocation local_40;
  PromiseBase local_28;
  PromiseForResult<Func_&,_void> promise;
  Func *func_local;
  
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)func;
  evalLater<kj::(anonymous_namespace)::TestCase1884::run()::Func&>
            ((kj *)&stack0xffffffffffffffe0,func);
  local_28.node.ptr = (OwnPromiseNode)(OwnPromiseNode)promise.super_PromiseBase.node.ptr;
  SourceLocation::SourceLocation
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
             ,"apply",0x643,0xc);
  location.function = local_40.function;
  location.fileName = local_40.fileName;
  location.lineNumber = local_40.lineNumber;
  location.columnNumber = local_40.columnNumber;
  Promise<int>::
  catch_<kj::RetryOnDisconnect_<kj::(anonymous_namespace)::TestCase1884::run()::Func&>::apply(kj::(anonymous_namespace)::TestCase1884::run()::Func&)::_lambda(kj::Exception&&)_1_>
            ((Promise<int> *)this,(Type *)&stack0xffffffffffffffe0,location);
  Promise<int>::~Promise((Promise<int> *)&stack0xffffffffffffffe0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

static inline PromiseForResult<Func, void> apply(Func& func) {
    auto promise = evalLater(func);
    return promise.catch_([&func](kj::Exception&& e) -> PromiseForResult<Func, void> {
      if (e.getType() == kj::Exception::Type::DISCONNECTED) {
        return func();
      } else {
        return kj::mv(e);
      }
    });
  }